

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-updating.cpp
# Opt level: O3

void wasm::TypeUpdating::updateParamTypes
               (Function *func,vector<wasm::Type,_std::allocator<wasm::Type>_> *newParamTypes,
               Module *wasm,LocalUpdatingMode localUpdating)

{
  Expression **__args;
  uint uVar1;
  Id IVar2;
  LocalSet *pLVar3;
  long *plVar4;
  LocalGet *pLVar5;
  undefined1 auVar6 [16];
  pointer ppLVar7;
  bool bVar8;
  Index IVar9;
  Type TVar10;
  mapped_type *pmVar11;
  size_t sVar12;
  Type TVar13;
  Expression *value;
  Block *pBVar14;
  iterator iVar15;
  ulong uVar16;
  Index index_1;
  Id index_00;
  undefined1 auVar17 [8];
  pointer ppLVar18;
  pointer ppLVar19;
  undefined1 auStack_208 [8];
  Index index;
  _Alloc_hider local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_> local_1d8;
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_100;
  undefined1 local_c8 [8];
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  paramFixups;
  undefined1 local_88 [8];
  FindAll<wasm::LocalGet> gets;
  FindAll<wasm::LocalSet> sets;
  Builder builder;
  
  local_c8 = (undefined1  [8])&paramFixups._M_h._M_rehash_policy._M_next_resize;
  paramFixups._M_h._M_buckets = (__buckets_ptr)&DAT_00000001;
  paramFixups._M_h._M_bucket_count = 0;
  paramFixups._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  paramFixups._M_h._M_element_count._0_4_ = 0x3f800000;
  paramFixups._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  paramFixups._M_h._M_rehash_policy._4_4_ = 0;
  paramFixups._M_h._M_rehash_policy._M_next_resize = 0;
  FindAll<wasm::LocalSet>::FindAll
            ((FindAll<wasm::LocalSet> *)
             &gets.list.super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,func->body);
  ppLVar19 = sets.list.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if ((pointer)gets.list.super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage !=
      sets.list.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    ppLVar18 = (pointer)gets.list.
                        super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage;
    do {
      pLVar3 = *ppLVar18;
      IVar9 = pLVar3->index;
      auStack_208._0_4_ = IVar9;
      bVar8 = Function::isParam(func,IVar9);
      if (bVar8) {
        uVar16 = ((ulong)auStack_208 & 0xffffffff) % (ulong)paramFixups._M_h._M_buckets;
        if (*(long **)((long)local_c8 + uVar16 * 8) != (long *)0x0) {
          plVar4 = (long *)**(long **)((long)local_c8 + uVar16 * 8);
          uVar1 = *(uint *)(plVar4 + 1);
          do {
            if (auStack_208._0_4_ == uVar1) goto LAB_00aa344f;
            plVar4 = (long *)*plVar4;
          } while ((plVar4 != (long *)0x0) &&
                  (uVar1 = *(uint *)(plVar4 + 1),
                  (ulong)uVar1 % (ulong)paramFixups._M_h._M_buckets == uVar16));
        }
        TVar13.id = (uintptr_t)paramFixups._M_h._M_buckets;
        bVar8 = wasm::Type::isSubType
                          ((Type)(pLVar3->value->type).id,
                           (Type)(newParamTypes->
                                 super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>).
                                 _M_impl.super__Vector_impl_data._M_start
                                 [(ulong)auStack_208 & 0xffffffff].id);
        if (!bVar8) {
          TVar10 = Function::getLocalType(func,auStack_208._0_4_);
          auVar6._8_8_ = 0;
          auVar6._0_8_ = TVar10.id;
          IVar9 = Builder::addVar((Builder *)func,(Function *)0x0,(Name)(auVar6 << 0x40),TVar13);
          pmVar11 = std::__detail::
                    _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  *)local_c8,(key_type *)auStack_208);
          *pmVar11 = IVar9;
        }
      }
LAB_00aa344f:
      ppLVar18 = ppLVar18 + 1;
    } while (ppLVar18 != ppLVar19);
  }
  __args = &func->body;
  FindAll<wasm::LocalGet>::FindAll((FindAll<wasm::LocalGet> *)local_88,*__args);
  if (paramFixups._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    auStack_208 = (undefined1  [8])0x0;
    _index = (Expression **)0x0;
    local_1f8._M_p = (pointer)0x0;
    uVar16 = 0;
    sets.list.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)wasm;
    while( true ) {
      sVar12 = Function::getNumParams(func);
      index_00 = (Id)uVar16;
      if (sVar12 <= uVar16) break;
      if (*(long **)((long)local_c8 + (uVar16 % (ulong)paramFixups._M_h._M_buckets) * 8) !=
          (long *)0x0) {
        plVar4 = (long *)**(long **)((long)local_c8 +
                                    (uVar16 % (ulong)paramFixups._M_h._M_buckets) * 8);
        IVar2 = *(Id *)(plVar4 + 1);
        while (index_00 != IVar2) {
          plVar4 = (long *)*plVar4;
          if ((plVar4 == (long *)0x0) ||
             (IVar2 = *(Id *)(plVar4 + 1),
             (ulong)IVar2 % (ulong)paramFixups._M_h._M_buckets !=
             uVar16 % (ulong)paramFixups._M_h._M_buckets)) goto LAB_00aa357b;
        }
        IVar9 = *(Index *)((long)plVar4 + 0xc);
        if (localUpdating == Update) {
          TVar13.id = (newParamTypes->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>).
                      _M_impl.super__Vector_impl_data._M_start[uVar16].id;
        }
        else {
          TVar13 = Function::getLocalType(func,index_00);
        }
        value = (Expression *)
                MixedArena::allocSpace
                          ((MixedArena *)
                           (sets.list.
                            super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage + 0x2b),0x18,8);
        value->_id = LocalGetId;
        value[1]._id = index_00;
        (value->type).id = TVar13.id;
        paramFixups._M_h._M_single_bucket =
             (__node_base_ptr)
             Builder::makeLocalSet
                       ((Builder *)
                        &sets.list.
                         super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,IVar9,value);
        std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
        emplace_back<wasm::Expression*>
                  ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_208,
                   (Expression **)&paramFixups._M_h._M_single_bucket);
      }
LAB_00aa357b:
      uVar16 = (ulong)(index_00 + BlockId);
    }
    if (_index == (Expression **)local_1f8._M_p) {
      std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
      _M_realloc_insert<wasm::Expression*const&>
                ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_208,_index,
                 __args);
    }
    else {
      *_index = *__args;
      _index = _index + 1;
    }
    pBVar14 = Builder::
              makeBlock<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_true>
                        ((Builder *)
                         &sets.list.
                          super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,
                         (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                         auStack_208);
    ppLVar7 = gets.list.super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    *__args = (Expression *)pBVar14;
    if (local_88 !=
        (undefined1  [8])
        gets.list.super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      auVar17 = local_88;
      do {
        pLVar5 = *(LocalGet **)auVar17;
        iVar15 = std::
                 _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         *)local_c8,&pLVar5->index);
        if (iVar15.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
            _M_cur != (__node_type *)0x0) {
          pLVar5->index =
               *(Index *)((long)iVar15.
                                super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                ._M_cur + 0xc);
        }
        auVar17 = (undefined1  [8])((long)auVar17 + 8);
      } while (auVar17 != (undefined1  [8])ppLVar7);
    }
    ppLVar19 = sets.list.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    if ((pointer)gets.list.super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage !=
        sets.list.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      ppLVar18 = (pointer)gets.list.
                          super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage;
      do {
        pLVar3 = *ppLVar18;
        iVar15 = std::
                 _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         *)local_c8,&pLVar3->index);
        if (iVar15.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
            _M_cur != (__node_type *)0x0) {
          pLVar3->index =
               *(Index *)((long)iVar15.
                                super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                ._M_cur + 0xc);
        }
        ppLVar18 = ppLVar18 + 1;
      } while (ppLVar18 != ppLVar19);
    }
    if (auStack_208 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_208,(long)local_1f8._M_p - (long)auStack_208);
    }
  }
  auVar17 = local_88;
  if (localUpdating == Update) {
    for (; ppLVar19 = (pointer)gets.list.
                               super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
        auVar17 !=
        (undefined1  [8])
        gets.list.super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>._M_impl.
        super__Vector_impl_data._M_start; auVar17 = (undefined1  [8])((long)auVar17 + 8)) {
      pLVar5 = *(LocalGet **)auVar17;
      uVar1 = pLVar5->index;
      bVar8 = Function::isParam(func,uVar1);
      if (bVar8) {
        (pLVar5->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id =
             (newParamTypes->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
             super__Vector_impl_data._M_start[uVar1].id;
      }
    }
    for (; ppLVar19 !=
           sets.list.super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>._M_impl
           .super__Vector_impl_data._M_start; ppLVar19 = ppLVar19 + 1) {
      pLVar3 = *ppLVar19;
      uVar1 = pLVar3->index;
      bVar8 = Function::isParam(func,uVar1);
      if ((bVar8) && (bVar8 = LocalSet::isTee(pLVar3), bVar8)) {
        (pLVar3->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression.type.id =
             (newParamTypes->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
             super__Vector_impl_data._M_start[uVar1].id;
        LocalSet::finalize(pLVar3);
      }
    }
  }
  ReFinalize::ReFinalize((ReFinalize *)auStack_208);
  local_1d8.currFunction = func;
  local_1d8.currModule = wasm;
  Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::walk
            (&local_1d8,__args);
  local_1d8.currFunction = (Function *)0x0;
  local_1d8.currModule = (Module *)0x0;
  auStack_208 = (undefined1  [8])&PTR__ReFinalize_00d72330;
  std::
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_100);
  if (local_1d8.stack.flexible.
      super__Vector_base<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task,_std::allocator<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1d8.stack.flexible.
                    super__Vector_base<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task,_std::allocator<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1d8.stack.flexible.
                          super__Vector_base<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task,_std::allocator<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1d8.stack.flexible.
                          super__Vector_base<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task,_std::allocator<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  auStack_208 = (undefined1  [8])&PTR__Pass_00d722d8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_p != &local_1e8) {
    operator_delete(local_1f8._M_p,local_1e8._M_allocated_capacity + 1);
  }
  if (paramFixups._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    handleNonDefaultableLocals(func,wasm);
  }
  if (local_88 != (undefined1  [8])0x0) {
    operator_delete((void *)local_88,
                    (long)gets.list.
                          super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)local_88);
  }
  if (gets.list.super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(gets.list.
                    super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                    (long)sets.list.
                          super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)gets.list.
                          super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)local_c8);
  return;
}

Assistant:

void updateParamTypes(Function* func,
                      const std::vector<Type>& newParamTypes,
                      Module& wasm,
                      LocalUpdatingMode localUpdating) {
  // Before making this update, we must be careful if the param was "reused",
  // specifically, if it is assigned a less-specific type in the body then
  // we'd get a validation error when we refine it. To handle that, if a less-
  // specific type is assigned simply switch to a new local, that is, we can
  // do a fixup like this:
  //
  // function foo(x : oldType) {
  //   ..
  //   x = (oldType)val;
  //
  // =>
  //
  // function foo(x : newType) {
  //   var x_oldType = x; // assign the param immediately to a fixup var
  //   ..
  //   x_oldType = (oldType)val; // fixup var is used throughout the body
  //
  // Later optimization passes may be able to remove the extra var, and can
  // take advantage of the refined argument type while doing so.

  // A map of params that need a fixup to the new fixup var used for it.
  std::unordered_map<Index, Index> paramFixups;

  FindAll<LocalSet> sets(func->body);

  for (auto* set : sets.list) {
    auto index = set->index;
    if (func->isParam(index) && !paramFixups.count(index) &&
        !Type::isSubType(set->value->type, newParamTypes[index])) {
      paramFixups[index] = Builder::addVar(func, func->getLocalType(index));
    }
  }

  FindAll<LocalGet> gets(func->body);

  // Apply the fixups we identified that we need.
  if (!paramFixups.empty()) {
    // Write the params immediately to the fixups.
    Builder builder(wasm);
    std::vector<Expression*> contents;
    for (Index index = 0; index < func->getNumParams(); index++) {
      auto iter = paramFixups.find(index);
      if (iter != paramFixups.end()) {
        auto fixup = iter->second;
        contents.push_back(builder.makeLocalSet(
          fixup,
          builder.makeLocalGet(index,
                               localUpdating == Update
                                 ? newParamTypes[index]
                                 : func->getLocalType(index))));
      }
    }
    contents.push_back(func->body);
    func->body = builder.makeBlock(contents);

    // Update gets and sets using the param to use the fixup.
    for (auto* get : gets.list) {
      auto iter = paramFixups.find(get->index);
      if (iter != paramFixups.end()) {
        get->index = iter->second;
      }
    }
    for (auto* set : sets.list) {
      auto iter = paramFixups.find(set->index);
      if (iter != paramFixups.end()) {
        set->index = iter->second;
      }
    }
  }

  // Update local.get/local.tee operations that use the modified param type.
  if (localUpdating == Update) {
    for (auto* get : gets.list) {
      auto index = get->index;
      if (func->isParam(index)) {
        get->type = newParamTypes[index];
      }
    }
    for (auto* set : sets.list) {
      auto index = set->index;
      if (func->isParam(index) && set->isTee()) {
        set->type = newParamTypes[index];
        set->finalize();
      }
    }
  }

  // Propagate the new get and set types outwards.
  ReFinalize().walkFunctionInModule(func, &wasm);

  if (!paramFixups.empty()) {
    // We have added locals, and must handle non-nullability of them.
    TypeUpdating::handleNonDefaultableLocals(func, wasm);
  }
}